

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

void Curl_ssl_delsessionid(Curl_easy *data,void *ssl_sessionid)

{
  Curl_ssl_session *pCVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (data->set).general_ssl.max_ssl_sessions + 1;
  lVar2 = -200;
  do {
    lVar4 = lVar2;
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      return;
    }
    pCVar1 = (data->state).session;
    lVar2 = lVar4 + 200;
  } while (*(void **)((long)&pCVar1[1].sessionid + lVar4) != ssl_sessionid);
  Curl_ssl_kill_session((Curl_ssl_session *)((long)&pCVar1[1].name + lVar4));
  return;
}

Assistant:

void Curl_ssl_delsessionid(struct Curl_easy *data, void *ssl_sessionid)
{
  size_t i;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    struct Curl_ssl_session *check = &data->state.session[i];

    if(check->sessionid == ssl_sessionid) {
      Curl_ssl_kill_session(check);
      break;
    }
  }
}